

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplydataimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyDataImpl::QNetworkReplyDataImpl
          (QNetworkReplyDataImpl *this,QObject *parent,QNetworkRequest *req,Operation op)

{
  long lVar1;
  long lVar2;
  QAnyStringView newValue;
  qsizetype qVar3;
  char cVar4;
  QNetworkReplyDataImplPrivate *this_00;
  long in_FS_OFFSET;
  QAnyStringView newValue_00;
  qint64 size;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QHttpHeaders h;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char16_t> local_58;
  QUrl url;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkReplyDataImplPrivate *)operator_new(0x240);
  QNetworkReplyDataImplPrivate::QNetworkReplyDataImplPrivate(this_00);
  QNetworkReply::QNetworkReply((QNetworkReply *)this,(QNetworkReplyPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002ca458;
  lVar2 = *(long *)(this + 8);
  QNetworkReply::setRequest((QNetworkReply *)this,req);
  QNetworkRequest::url((QNetworkRequest *)&local_58);
  QNetworkReply::setUrl((QNetworkReply *)this,(QUrl *)&local_58);
  QUrl::~QUrl((QUrl *)&local_58);
  QNetworkReply::setOperation((QNetworkReply *)this,op);
  QNetworkReply::setFinished((QNetworkReply *)this,true);
  QIODevice::open(this,1);
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)&url);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  cVar4 = qDecodeDataUrl(&url,(QString *)&local_58,(QByteArray *)&local_78);
  qVar3 = local_78.size;
  if (cVar4 == '\0') {
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::translate((char *)&local_b0,"QNetworkAccessDataBackend","Invalid URI: %1",0);
    QUrl::toString(&size,&url,0);
    QString::arg<QString,_true>
              ((QString *)&local_98,(QString *)&local_b0,(QString *)&size,0,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&size);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QNetworkReply::setError((QNetworkReply *)this,ProtocolFailure,(QString *)&local_98);
    size = CONCAT44(size._4_4_,399);
    local_b0.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::
                          metaType;
    local_b0.ptr = L"QNetworkReply::NetworkError";
    local_b0.size = (qsizetype)&size;
    QMetaObject::invokeMethod<QMetaMethodArgument>
              ((QObject *)this,"errorOccurred",QueuedConnection,(QMetaMethodArgument *)&local_b0);
    QMetaObject::invokeMethod<>((QObject *)this,"finished",QueuedConnection);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  else {
    size = local_78.size;
    h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkReply::headers((QNetworkReply *)&h);
    newValue_00.m_size = local_58.size + 0x8000000000000000;
    newValue_00.field_0.m_data = local_58.ptr;
    QHttpHeaders::replaceOrAppend(&h,ContentType,newValue_00);
    QByteArray::number((longlong)&local_98,(int)qVar3);
    newValue.m_size = local_98.size;
    newValue.field_0.m_data_utf16 = local_98.ptr;
    QHttpHeaders::replaceOrAppend(&h,ContentLength,newValue);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    QNetworkReply::setHeaders((QNetworkReply *)this,&h);
    QMetaObject::invokeMethod<>((QObject *)this,"metaDataChanged",QueuedConnection);
    QBuffer::setData((QByteArray *)(lVar2 + 0x230));
    QBuffer::open((QByteArray *)(lVar2 + 0x230),1);
    local_98.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
    local_98.ptr = L"qint64";
    local_b0.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
    local_b0.ptr = L"qint64";
    local_b0.size = (qsizetype)&size;
    local_98.size = (qsizetype)&size;
    QMetaObject::invokeMethod<QMetaMethodArgument,QMetaMethodArgument>
              ((QObject *)this,"downloadProgress",QueuedConnection,(QMetaMethodArgument *)&local_98,
               (QMetaMethodArgument *)&local_b0);
    QMetaObject::invokeMethod<>((QObject *)this,"readyRead",QueuedConnection);
    QMetaObject::invokeMethod<>((QObject *)this,"finished",QueuedConnection);
    QHttpHeaders::~QHttpHeaders(&h);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QUrl::~QUrl(&url);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyDataImpl::QNetworkReplyDataImpl(QObject *parent, const QNetworkRequest &req, const QNetworkAccessManager::Operation op)
    : QNetworkReply(*new QNetworkReplyDataImplPrivate(), parent)
{
    Q_D(QNetworkReplyDataImpl);
    setRequest(req);
    setUrl(req.url());
    setOperation(op);
    setFinished(true);
    QNetworkReply::open(QIODevice::ReadOnly);

    QUrl url = req.url();
    QString mimeType;
    QByteArray payload;
    if (qDecodeDataUrl(url, mimeType, payload)) {
        qint64 size = payload.size();
        auto h = headers();
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentType, mimeType);
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentLength, QByteArray::number(size));
        setHeaders(std::move(h));

        QMetaObject::invokeMethod(this, "metaDataChanged", Qt::QueuedConnection);

        d->decodedData.setData(payload);
        d->decodedData.open(QIODevice::ReadOnly);

        QMetaObject::invokeMethod(this, "downloadProgress", Qt::QueuedConnection,
                                  Q_ARG(qint64,size), Q_ARG(qint64, size));
        QMetaObject::invokeMethod(this, "readyRead", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    } else {
        // something wrong with this URI
        const QString msg = QCoreApplication::translate("QNetworkAccessDataBackend",
                                                        "Invalid URI: %1").arg(url.toString());
        setError(QNetworkReply::ProtocolFailure, msg);
        QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                                  Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ProtocolFailure));
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    }
}